

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::setAttribute
          (RuleBasedCollator *this,UColAttribute attr,UColAttributeValue value,UErrorCode *errorCode
          )

{
  UBool UVar1;
  UColAttributeValue UVar2;
  CollationSettings *pCVar3;
  CollationSettings *this_00;
  CollationSettings *ownedSettings;
  CollationSettings *defaultSettings;
  UColAttributeValue oldValue;
  UErrorCode *errorCode_local;
  UColAttributeValue value_local;
  UColAttribute attr_local;
  RuleBasedCollator *this_local;
  
  UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,(ulong)attr,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (value == UVar2) {
      setAttributeExplicitly(this,attr);
    }
    else {
      pCVar3 = getDefaultSettings(this);
      if ((this->settings == pCVar3) && (value == UCOL_DEFAULT)) {
        setAttributeDefault(this,attr);
      }
      else {
        this_00 = SharedObject::copyOnWrite<icu_63::CollationSettings>(&this->settings);
        if (this_00 == (CollationSettings *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          switch(attr) {
          case UCOL_FRENCH_COLLATION:
            CollationSettings::setFlag(this_00,0x800,value,pCVar3->options,errorCode);
            break;
          case UCOL_ALTERNATE_HANDLING:
            CollationSettings::setAlternateHandling(this_00,value,pCVar3->options,errorCode);
            break;
          case UCOL_CASE_FIRST:
            CollationSettings::setCaseFirst(this_00,value,pCVar3->options,errorCode);
            break;
          case UCOL_CASE_LEVEL:
            CollationSettings::setFlag(this_00,0x400,value,pCVar3->options,errorCode);
            break;
          case UCOL_DECOMPOSITION_MODE:
            CollationSettings::setFlag(this_00,1,value,pCVar3->options,errorCode);
            break;
          case UCOL_STRENGTH:
            CollationSettings::setStrength(this_00,value,pCVar3->options,errorCode);
            break;
          case UCOL_HIRAGANA_QUATERNARY_MODE:
            if (((value != UCOL_OFF) && (value != UCOL_ON)) && (value != UCOL_DEFAULT)) {
              *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            }
            break;
          case UCOL_NUMERIC_COLLATION:
            CollationSettings::setFlag(this_00,2,value,pCVar3->options,errorCode);
            break;
          default:
            *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          }
          UVar1 = ::U_FAILURE(*errorCode);
          if (UVar1 == '\0') {
            setFastLatinOptions(this,this_00);
            if (value == UCOL_DEFAULT) {
              setAttributeDefault(this,attr);
            }
            else {
              setAttributeExplicitly(this,attr);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
RuleBasedCollator::setAttribute(UColAttribute attr, UColAttributeValue value,
                                UErrorCode &errorCode) {
    UColAttributeValue oldValue = getAttribute(attr, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    if(value == oldValue) {
        setAttributeExplicitly(attr);
        return;
    }
    const CollationSettings &defaultSettings = getDefaultSettings();
    if(settings == &defaultSettings) {
        if(value == UCOL_DEFAULT) {
            setAttributeDefault(attr);
            return;
        }
    }
    CollationSettings *ownedSettings = SharedObject::copyOnWrite(settings);
    if(ownedSettings == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    switch(attr) {
    case UCOL_FRENCH_COLLATION:
        ownedSettings->setFlag(CollationSettings::BACKWARD_SECONDARY, value,
                               defaultSettings.options, errorCode);
        break;
    case UCOL_ALTERNATE_HANDLING:
        ownedSettings->setAlternateHandling(value, defaultSettings.options, errorCode);
        break;
    case UCOL_CASE_FIRST:
        ownedSettings->setCaseFirst(value, defaultSettings.options, errorCode);
        break;
    case UCOL_CASE_LEVEL:
        ownedSettings->setFlag(CollationSettings::CASE_LEVEL, value,
                               defaultSettings.options, errorCode);
        break;
    case UCOL_NORMALIZATION_MODE:
        ownedSettings->setFlag(CollationSettings::CHECK_FCD, value,
                               defaultSettings.options, errorCode);
        break;
    case UCOL_STRENGTH:
        ownedSettings->setStrength(value, defaultSettings.options, errorCode);
        break;
    case UCOL_HIRAGANA_QUATERNARY_MODE:
        // Deprecated attribute. Check for valid values but do not change anything.
        if(value != UCOL_OFF && value != UCOL_ON && value != UCOL_DEFAULT) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        }
        break;
    case UCOL_NUMERIC_COLLATION:
        ownedSettings->setFlag(CollationSettings::NUMERIC, value, defaultSettings.options, errorCode);
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        break;
    }
    if(U_FAILURE(errorCode)) { return; }
    setFastLatinOptions(*ownedSettings);
    if(value == UCOL_DEFAULT) {
        setAttributeDefault(attr);
    } else {
        setAttributeExplicitly(attr);
    }
}